

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_view.hpp
# Opt level: O3

string * __thiscall
protozero::data_view::to_string_abi_cxx11_(string *__return_storage_ptr__,data_view *this)

{
  char *pcVar1;
  size_t sVar2;
  assert_error *this_00;
  
  pcVar1 = this->m_data;
  if (pcVar1 != (char *)0x0) {
    sVar2 = this->m_size;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + sVar2);
    return __return_storage_ptr__;
  }
  this_00 = (assert_error *)__cxa_allocate_exception(0x10);
  assert_error::assert_error(this_00,"m_data");
  __cxa_throw(this_00,&assert_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string to_string() const {
        protozero_assert(m_data);
        return {m_data, m_size};
    }